

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerivedModule.h
# Opt level: O0

any __thiscall
Scine::Core::DerivedModule::detail::ResolveModel::operator()
          (ResolveModel *this,
          pair<Scine::Core::DummyInterface,_boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>
          *param_2)

{
  string *in_RSI;
  CreateInterfacePointer<Scine::Core::DummyInterface> *in_RDI;
  string *in_stack_ffffffffffffff78;
  CreateInterfacePointer<Scine::Core::DummyInterface> *p;
  string local_58 [88];
  
  p = in_RDI;
  ::std::__cxx11::string::string(local_58,in_RSI);
  ModelTypeIdentifierMatches::ModelTypeIdentifierMatches
            ((ModelTypeIdentifierMatches *)in_RDI,in_stack_ffffffffffffff78);
  exec_if<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,Scine::Core::DerivedModule::detail::ModelTypeIdentifierMatches,Scine::Core::DerivedModule::detail::CreateInterfacePointer<Scine::Core::DummyInterface>>
            ((ModelTypeIdentifierMatches *)p,in_RDI,
             (vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>
              *)in_stack_ffffffffffffff78);
  ModelTypeIdentifierMatches::~ModelTypeIdentifierMatches((ModelTypeIdentifierMatches *)0x122e6f);
  ::std::__cxx11::string::~string(local_58);
  return (any)(placeholder *)p;
}

Assistant:

boost::any operator()(PairType* /* model */ = 0) const {
    using InterfaceType = typename boost::mpl::first<PairType>::type;
    using ModelTypeList = typename boost::mpl::second<PairType>::type;

    return detail::exec_if<ModelTypeList>(detail::ModelTypeIdentifierMatches{identifier},
                                          CreateInterfacePointer<InterfaceType>{});
  }